

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::GetRPath
          (cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runtimeDirs,bool for_install)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  size_type sVar3;
  cmGeneratorTarget *pcVar4;
  pointer pbVar5;
  pointer pcVar6;
  size_type sVar7;
  cmComputeLinkInformation *pcVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  int iVar13;
  undefined7 extraout_var;
  cmValue cVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar15;
  string *psVar16;
  LinkClosure *pLVar17;
  long *plVar18;
  size_type *psVar19;
  pointer pbVar20;
  byte bVar21;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar22;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  string install_rpath;
  string d;
  string rootPath;
  string dirVar;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string targetOutputDir;
  undefined1 local_178 [32];
  string *local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_150;
  cmComputeLinkInformation *local_148;
  byte local_13d;
  undefined4 local_13c;
  undefined1 local_138 [32];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_118;
  string local_110;
  string *local_f0;
  string local_e8;
  string *local_b8;
  string *local_b0;
  undefined1 local_a8 [32];
  _Base_ptr local_88;
  size_t local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  pcVar2 = this->Makefile;
  local_178._0_8_ = local_178 + 0x10;
  local_148 = this;
  local_118 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)runtimeDirs;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"CMAKE_SKIP_RPATH","");
  bVar9 = cmMakefile::IsOn(pcVar2,(string *)local_178);
  sVar3 = (local_148->RuntimeFlag)._M_string_length;
  if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  bVar10 = true;
  if (!for_install) {
    pcVar4 = local_148->Target;
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,"BUILD_WITH_INSTALL_RPATH","");
    bVar10 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,(string *)local_178);
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
    }
  }
  pcVar8 = local_148;
  if (bVar9 || sVar3 == 0) {
    bVar21 = 0;
LAB_003c7ce6:
    bVar12 = 0;
    local_13c = 0;
  }
  else {
    psVar16 = &local_148->Config;
    bVar9 = cmGeneratorTarget::HaveInstallTreeRPATH(local_148->Target,psVar16);
    bVar11 = cmGeneratorTarget::HaveBuildTreeRPATH(pcVar8->Target,psVar16);
    bVar21 = bVar11 & (bVar10 ^ 1U);
    if ((bVar10 ^ 1U) != 0) goto LAB_003c7ce6;
    pcVar2 = pcVar8->Makefile;
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,"CMAKE_SKIP_INSTALL_RPATH","");
    bVar11 = cmMakefile::IsOn(pcVar2,(string *)local_178);
    if (bVar11) {
      local_13c = 0;
    }
    else {
      pcVar4 = local_148->Target;
      local_a8._0_8_ = local_a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a8,"INSTALL_RPATH_USE_LINK_PATH","");
      bVar11 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,(string *)local_a8);
      local_13c = (undefined4)CONCAT71(extraout_var,bVar11);
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
    }
    bVar12 = bVar10 & bVar9;
  }
  pcVar2 = local_148->Makefile;
  local_178._0_8_ = local_178 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_178,"CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN","");
  local_b8 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_178);
  if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  pcVar8 = local_148;
  psVar16 = &local_148->Config;
  cmGeneratorTarget::GetDirectory(&local_50,local_148->Target,psVar16,RuntimeBinaryArtifact);
  pcVar4 = pcVar8->Target;
  local_178._0_8_ = local_178 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"BUILD_RPATH_USE_ORIGIN","");
  bVar9 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,(string *)local_178);
  sVar3 = local_b8->_M_string_length;
  local_13d = local_50._M_string_length != 0;
  if ((string *)local_178._0_8_ != (string *)(local_178 + 0x10)) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  local_a8._24_8_ = local_a8 + 8;
  local_a8._8_4_ = _S_red;
  local_a8._16_8_ = 0;
  local_80 = 0;
  local_88 = (_Base_ptr)local_a8._24_8_;
  if (bVar12 != 0) {
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    cmGeneratorTarget::GetInstallRPATH(local_148->Target,psVar16,(string *)local_178);
    cmCLI_ExpandListUnique
              ((string *)local_178._0_8_,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_178._8_8_,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_118);
    if ((string *)local_178._0_8_ != (string *)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
    }
  }
  if (bVar21 == 0) {
    if ((char)local_13c == '\0') goto LAB_003c8683;
  }
  else {
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
    bVar10 = cmGeneratorTarget::GetBuildRPATH(local_148->Target,psVar16,(string *)local_178);
    if (bVar10) {
      cmCLI_ExpandListUnique
                ((string *)local_178._0_8_,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_178._8_8_,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_118);
    }
    if ((string *)local_178._0_8_ != (string *)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
    }
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  pcVar2 = local_148->Makefile;
  local_178._0_8_ = local_178 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"CMAKE_SYSROOT_LINK","");
  cVar14 = cmMakefile::GetDefinition(pcVar2,(string *)local_178);
  if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  if (cVar14.Value == (string *)0x0) {
    pcVar2 = local_148->Makefile;
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"CMAKE_SYSROOT","");
    cmMakefile::GetSafeDefinition(pcVar2,(string *)local_178);
    std::__cxx11::string::_M_assign((string *)&local_110);
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_110);
  }
  pcVar2 = local_148->Makefile;
  local_178._0_8_ = local_178 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"CMAKE_STAGING_PREFIX","");
  cVar14 = cmMakefile::GetDefinition(pcVar2,(string *)local_178);
  if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  pcVar2 = local_148->Makefile;
  local_178._0_8_ = local_178 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"CMAKE_INSTALL_PREFIX","");
  local_b0 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_178);
  if ((string *)local_178._0_8_ != (string *)(local_178 + 0x10)) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  cmsys::SystemTools::ConvertToUnixSlashes(&local_110);
  pcVar8 = local_148;
  pvVar15 = cmOrderDirectories::GetOrderedDirectories_abi_cxx11_
                      ((local_148->OrderRuntimeSearchPath)._M_t.
                       super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
                       .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl);
  local_78 = psVar16;
  local_f0 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar8->CMakeInstance);
  pbVar20 = (pvVar15->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (pvVar15->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar20 != pbVar5) {
    bVar12 = bVar9 & local_13d;
    do {
      if (bVar21 == 0) {
        if ((char)local_13c != '\0') {
          psVar16 = cmake::GetHomeDirectory_abi_cxx11_(local_148->CMakeInstance);
          bVar9 = cmsys::SystemTools::ComparePath(pbVar20,psVar16);
          if ((((!bVar9) && (bVar9 = cmsys::SystemTools::ComparePath(pbVar20,local_f0), !bVar9)) &&
              (bVar9 = cmsys::SystemTools::IsSubDirectory(pbVar20,psVar16), !bVar9)) &&
             (bVar9 = cmsys::SystemTools::IsSubDirectory(pbVar20,local_f0), !bVar9)) {
            local_138._0_8_ = local_138 + 0x10;
            pcVar6 = (pbVar20->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_138,pcVar6,pcVar6 + pbVar20->_M_string_length);
            if (local_110._M_string_length == 0) {
LAB_003c83eb:
              if ((cVar14.Value != (string *)0x0) &&
                 (sVar7 = (cVar14.Value)->_M_string_length, sVar7 != 0)) {
                local_178._0_8_ = local_138._8_8_;
                local_178._8_8_ = local_138._0_8_;
                __str_02._M_str = ((cVar14.Value)->_M_dataplus)._M_p;
                __str_02._M_len = sVar7;
                iVar13 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                   ((basic_string_view<char,_std::char_traits<char>_> *)local_178,0,
                                    sVar7,__str_02);
                if (iVar13 == 0) {
                  std::__cxx11::string::erase((ulong)local_138,0);
                  local_178._8_8_ = (local_b0->_M_dataplus)._M_p;
                  local_178._0_8_ = local_b0->_M_string_length;
                  local_e8._M_dataplus._M_p = (pointer)0x1;
                  local_178._24_8_ = &local_e8.field_2;
                  local_e8.field_2._M_local_buf[0] = 0x2f;
                  local_178._16_8_ = (pointer)0x1;
                  local_158 = (string *)local_138._8_8_;
                  local_150 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_138._0_8_;
                  views_00._M_len = 3;
                  views_00._M_array = (iterator)local_178;
                  local_e8._M_string_length = local_178._24_8_;
                  cmCatViews_abi_cxx11_(&local_70,views_00);
                  std::__cxx11::string::operator=((string *)local_138,(string *)&local_70);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_70._M_dataplus._M_p != &local_70.field_2) {
                    operator_delete(local_70._M_dataplus._M_p,
                                    local_70.field_2._M_allocated_capacity + 1);
                  }
                  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_138);
                }
              }
            }
            else {
              local_178._0_8_ = local_138._8_8_;
              local_178._8_8_ = local_138._0_8_;
              __str_01._M_str = local_110._M_dataplus._M_p;
              __str_01._M_len = local_110._M_string_length;
              iVar13 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                 ((basic_string_view<char,_std::char_traits<char>_> *)local_178,0,
                                  local_110._M_string_length,__str_01);
              if (iVar13 != 0) goto LAB_003c83eb;
              std::__cxx11::string::erase((ulong)local_138,0);
            }
            pVar22 = std::
                     _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     ::_M_insert_unique<std::__cxx11::string_const&>
                               ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)local_a8,(string *)local_138);
            if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_118,(string *)local_138);
            }
            goto LAB_003c85f8;
          }
        }
      }
      else {
        local_138._0_8_ = local_138 + 0x10;
        pcVar6 = (pbVar20->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_138,pcVar6,pcVar6 + pbVar20->_M_string_length);
        if (local_110._M_string_length == 0) {
LAB_003c81cc:
          if ((cVar14.Value != (string *)0x0) &&
             (sVar7 = (cVar14.Value)->_M_string_length, sVar7 != 0)) {
            local_178._0_8_ = local_138._8_8_;
            local_178._8_8_ = local_138._0_8_;
            __str_00._M_str = ((cVar14.Value)->_M_dataplus)._M_p;
            __str_00._M_len = sVar7;
            iVar13 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                               ((basic_string_view<char,_std::char_traits<char>_> *)local_178,0,
                                sVar7,__str_00);
            if (iVar13 == 0) {
              std::__cxx11::string::erase((ulong)local_138,0);
              local_178._8_8_ = (local_b0->_M_dataplus)._M_p;
              local_178._0_8_ = local_b0->_M_string_length;
              local_e8._M_dataplus._M_p = (pointer)0x1;
              local_178._24_8_ = &local_e8.field_2;
              local_e8.field_2._M_local_buf[0] = 0x2f;
              local_178._16_8_ = (pointer)0x1;
              local_158 = (string *)local_138._8_8_;
              local_150 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_138._0_8_;
              views_01._M_len = 3;
              views_01._M_array = (iterator)local_178;
              local_e8._M_string_length = local_178._24_8_;
              cmCatViews_abi_cxx11_(&local_70,views_01);
              std::__cxx11::string::operator=((string *)local_138,(string *)&local_70);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
              cmsys::SystemTools::ConvertToUnixSlashes((string *)local_138);
              goto LAB_003c85d6;
            }
          }
          if (((bVar12 & sVar3 != 0) != 0) &&
             ((bVar9 = cmsys::SystemTools::ComparePath((string *)local_138,local_f0), bVar9 ||
              (bVar9 = cmsys::SystemTools::IsSubDirectory((string *)local_138,local_f0), bVar9)))) {
            cmSystemTools::RelativePath((string *)local_178,&local_50,(string *)local_138);
            std::__cxx11::string::operator=((string *)local_138,(string *)local_178);
            if ((string *)local_178._0_8_ != (string *)(local_178 + 0x10)) {
              operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
            }
            if ((string *)local_138._8_8_ == (string *)0x0) {
              std::__cxx11::string::_M_assign((string *)local_138);
            }
            else {
              local_178._8_8_ = (local_b8->_M_dataplus)._M_p;
              local_178._0_8_ = local_b8->_M_string_length;
              local_178._16_8_ = (pointer)0x1;
              local_178._24_8_ =
                   (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
              local_158 = (string *)local_138._8_8_;
              local_150 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_138._0_8_;
              views._M_len = 3;
              views._M_array = (iterator)local_178;
              cmCatViews_abi_cxx11_(&local_e8,views);
              std::__cxx11::string::operator=((string *)local_138,(string *)&local_e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
        }
        else {
          local_178._0_8_ = local_138._8_8_;
          local_178._8_8_ = local_138._0_8_;
          __str._M_str = local_110._M_dataplus._M_p;
          __str._M_len = local_110._M_string_length;
          iVar13 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_178,0,
                              local_110._M_string_length,__str);
          if (iVar13 != 0) goto LAB_003c81cc;
          std::__cxx11::string::erase((ulong)local_138,0);
        }
LAB_003c85d6:
        pVar22 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)local_a8,(string *)local_138);
        if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_118,(string *)local_138);
        }
LAB_003c85f8:
        if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_138._0_8_ !=
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
        }
      }
      pbVar20 = pbVar20 + 1;
    } while (pbVar20 != pbVar5);
  }
  psVar16 = local_78;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
    psVar16 = local_78;
  }
LAB_003c8683:
  pLVar17 = cmGeneratorTarget::GetLinkClosure(local_148->Target,psVar16);
  pbVar20 = (pLVar17->Languages).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (pLVar17->Languages).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar20 != pbVar5) {
    paVar1 = &local_e8.field_2;
    do {
      std::operator+(&local_e8,"CMAKE_",pbVar20);
      plVar18 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_178._0_8_ = local_178 + 0x10;
      psVar16 = (string *)(plVar18 + 2);
      if ((string *)*plVar18 == psVar16) {
        local_178._16_8_ = (psVar16->_M_dataplus)._M_p;
        local_178._24_8_ = plVar18[3];
      }
      else {
        local_178._16_8_ = (psVar16->_M_dataplus)._M_p;
        local_178._0_8_ = (string *)*plVar18;
      }
      local_178._8_8_ = plVar18[1];
      *plVar18 = (long)psVar16;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      bVar9 = cmMakefile::IsOn(local_148->Makefile,(string *)local_178);
      if (bVar9) {
        std::operator+(&local_110,"CMAKE_",pbVar20);
        plVar18 = (long *)std::__cxx11::string::append((char *)&local_110);
        psVar19 = (size_type *)(plVar18 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar18 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_e8.field_2._M_allocated_capacity = *psVar19;
          local_e8.field_2._8_8_ = plVar18[3];
          local_e8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar19;
          local_e8._M_dataplus._M_p = (pointer)*plVar18;
        }
        local_e8._M_string_length = plVar18[1];
        *plVar18 = (long)psVar19;
        plVar18[1] = 0;
        *(undefined1 *)(plVar18 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,
                          CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                   local_110.field_2._M_local_buf[0]) + 1);
        }
        cVar14 = cmMakefile::GetDefinition(local_148->Makefile,&local_e8);
        if (cVar14.Value != (string *)0x0) {
          cmCLI_ExpandListUnique
                    ((string *)((cVar14.Value)->_M_dataplus)._M_p,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(cVar14.Value)->_M_string_length,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_118);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((string *)local_178._0_8_ != (string *)(local_178 + 0x10)) {
        operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
      }
      pbVar20 = pbVar20 + 1;
    } while (pbVar20 != pbVar5);
  }
  cmCLI_ExpandListUnique
            ((string *)(local_148->RuntimeAlways)._M_dataplus._M_p,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_148->RuntimeAlways)._M_string_length,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_118);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::GetRPath(std::vector<std::string>& runtimeDirs,
                                        bool for_install) const
{
  // Select whether to generate runtime search directories.
  bool outputRuntime =
    !this->Makefile->IsOn("CMAKE_SKIP_RPATH") && !this->RuntimeFlag.empty();

  // Select whether to generate an rpath for the install tree or the
  // build tree.
  bool linking_for_install =
    (for_install ||
     this->Target->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"));
  bool use_install_rpath =
    (outputRuntime && this->Target->HaveInstallTreeRPATH(this->Config) &&
     linking_for_install);
  bool use_build_rpath =
    (outputRuntime && this->Target->HaveBuildTreeRPATH(this->Config) &&
     !linking_for_install);
  bool use_link_rpath = outputRuntime && linking_for_install &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH") &&
    this->Target->GetPropertyAsBool("INSTALL_RPATH_USE_LINK_PATH");

  // Select whether to use $ORIGIN in RPATHs for artifacts in the build tree.
  std::string const& originToken = this->Makefile->GetSafeDefinition(
    "CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN");
  std::string targetOutputDir = this->Target->GetDirectory(this->Config);
  bool use_relative_build_rpath =
    this->Target->GetPropertyAsBool("BUILD_RPATH_USE_ORIGIN") &&
    !originToken.empty() && !targetOutputDir.empty();

  // Construct the RPATH.
  std::set<std::string> emitted;
  if (use_install_rpath) {
    std::string install_rpath;
    this->Target->GetInstallRPATH(this->Config, install_rpath);
    cmCLI_ExpandListUnique(install_rpath, runtimeDirs, emitted);
  }
  if (use_build_rpath) {
    // Add directories explicitly specified by user
    std::string build_rpath;
    if (this->Target->GetBuildRPATH(this->Config, build_rpath)) {
      // This will not resolve entries to use $ORIGIN, the user is expected
      // to do that if necessary.
      cmCLI_ExpandListUnique(build_rpath, runtimeDirs, emitted);
    }
  }
  if (use_build_rpath || use_link_rpath) {
    std::string rootPath;
    if (cmValue sysrootLink =
          this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
      rootPath = *sysrootLink;
    } else {
      rootPath = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
    }
    cmValue stagePath = this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");
    std::string const& installPrefix =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
    cmSystemTools::ConvertToUnixSlashes(rootPath);
    std::vector<std::string> const& rdirs = this->GetRuntimeSearchPath();
    std::string const& topBinaryDir =
      this->CMakeInstance->GetHomeOutputDirectory();
    for (std::string const& ri : rdirs) {
      // Put this directory in the rpath if using build-tree rpath
      // support or if using the link path as an rpath.
      if (use_build_rpath) {
        std::string d = ri;
        if (!rootPath.empty() && cmHasPrefix(d, rootPath)) {
          d.erase(0, rootPath.size());
        } else if (cmNonempty(stagePath) && cmHasPrefix(d, *stagePath)) {
          d.erase(0, (*stagePath).size());
          d = cmStrCat(installPrefix, '/', d);
          cmSystemTools::ConvertToUnixSlashes(d);
        } else if (use_relative_build_rpath) {
          // If expansion of the $ORIGIN token is supported and permitted per
          // policy, use relative paths in the RPATH.
          if (cmSystemTools::ComparePath(d, topBinaryDir) ||
              cmSystemTools::IsSubDirectory(d, topBinaryDir)) {
            d = cmSystemTools::RelativePath(targetOutputDir, d);
            if (!d.empty()) {
              d = cmStrCat(originToken, "/", d);
            } else {
              d = originToken;
            }
          }
        }
        if (emitted.insert(d).second) {
          runtimeDirs.push_back(std::move(d));
        }
      } else if (use_link_rpath) {
        // Do not add any path inside the source or build tree.
        std::string const& topSourceDir =
          this->CMakeInstance->GetHomeDirectory();
        if (!cmSystemTools::ComparePath(ri, topSourceDir) &&
            !cmSystemTools::ComparePath(ri, topBinaryDir) &&
            !cmSystemTools::IsSubDirectory(ri, topSourceDir) &&
            !cmSystemTools::IsSubDirectory(ri, topBinaryDir)) {
          std::string d = ri;
          if (!rootPath.empty() && cmHasPrefix(d, rootPath)) {
            d.erase(0, rootPath.size());
          } else if (cmNonempty(stagePath) && cmHasPrefix(d, *stagePath)) {
            d.erase(0, (*stagePath).size());
            d = cmStrCat(installPrefix, '/', d);
            cmSystemTools::ConvertToUnixSlashes(d);
          }
          if (emitted.insert(d).second) {
            runtimeDirs.push_back(std::move(d));
          }
        }
      }
    }
  }

  // Add runtime paths required by the languages to always be
  // present.  This is done even when skipping rpath support.
  {
    cmGeneratorTarget::LinkClosure const* lc =
      this->Target->GetLinkClosure(this->Config);
    for (std::string const& li : lc->Languages) {
      std::string useVar =
        "CMAKE_" + li + "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH";
      if (this->Makefile->IsOn(useVar)) {
        std::string dirVar = "CMAKE_" + li + "_IMPLICIT_LINK_DIRECTORIES";
        if (cmValue dirs = this->Makefile->GetDefinition(dirVar)) {
          cmCLI_ExpandListUnique(*dirs, runtimeDirs, emitted);
        }
      }
    }
  }

  // Add runtime paths required by the platform to always be
  // present.  This is done even when skipping rpath support.
  cmCLI_ExpandListUnique(this->RuntimeAlways, runtimeDirs, emitted);
}